

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::egl::ChooseConfigRandomCase::iterate(ChooseConfigRandomCase *this)

{
  Random *this_00;
  int iVar1;
  int iVar2;
  TestLog *this_01;
  MessageBuilder *pMVar3;
  size_type sVar4;
  undefined1 local_1c8 [8];
  vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> attributes;
  int numAttribs;
  Random rnd;
  MessageBuilder local_190;
  ChooseConfigRandomCase *local_10;
  ChooseConfigRandomCase *this_local;
  
  local_10 = this;
  this_01 = tcu::TestContext::getLog
                      ((this->super_ChooseConfigCase).super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx);
  tcu::TestLog::operator<<(&local_190,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<(&local_190,(char (*) [12])"Iteration :");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&this->m_iterNdx);
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_190);
  this->m_iterNdx = this->m_iterNdx + 1;
  this_00 = (Random *)
            ((long)&attributes.
                    super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  de::Random::Random(this_00,this->m_iterNdx);
  sVar4 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::size
                    (&this->m_attribSet);
  attributes.
  super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
       de::Random::getInt(this_00,0,(int)sVar4 * 2);
  genRandomAttributes((vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                       *)local_1c8,this,&this->m_attribSet,
                      (int)attributes.
                           super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (Random *)
                      ((long)&attributes.
                              super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  ChooseConfigCase::fillDontCare
            (&this->super_ChooseConfigCase,
             (vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *
             )local_1c8);
  ChooseConfigCase::executeTest
            (&this->super_ChooseConfigCase,
             (vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *
             )local_1c8,(bool)((this->super_ChooseConfigCase).m_checkOrder & 1));
  iVar1 = this->m_iterNdx;
  iVar2 = this->m_numIters;
  std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::~vector
            ((vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *
             )local_1c8);
  de::Random::~Random((Random *)
                      ((long)&attributes.
                              super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  return (uint)(iVar1 < iVar2);
}

Assistant:

TestCase::IterateResult iterate (void)
	{
		m_testCtx.getLog() << TestLog::Message << "Iteration :" << m_iterNdx << TestLog::EndMessage;
		m_iterNdx += 1;

		// Build random list of attributes
		de::Random									rnd(m_iterNdx);
		const int									numAttribs	= rnd.getInt(0, (int)m_attribSet.size()*2);

		std::vector<std::pair<EGLenum, EGLint> >	attributes	= genRandomAttributes(m_attribSet, numAttribs, rnd);

		fillDontCare(attributes);
		executeTest(attributes, m_checkOrder);

		return m_iterNdx < m_numIters ? CONTINUE : STOP;
	}